

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_get.c
# Opt level: O3

int mpt_valfmt_get(mpt_value_format *ptr,char *src)

{
  char cVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  char *__nptr;
  long lVar10;
  ushort uVar11;
  uint16_t uVar12;
  ushort uVar13;
  char *next;
  uint8_t local_4c;
  char *local_38;
  
  if (src == (char *)0x0) {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return 0;
  }
  ppuVar3 = __ctype_b_loc();
  puVar2 = *ppuVar3;
  iVar8 = -1;
  pcVar9 = src;
  do {
    __nptr = pcVar9;
    cVar1 = *__nptr;
    lVar10 = (long)cVar1;
    pcVar9 = __nptr + 1;
    iVar8 = iVar8 + 1;
  } while ((*(byte *)((long)puVar2 + lVar10 * 2 + 1) & 0x20) != 0);
  if (cVar1 == '\0') {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return iVar8;
  }
  if (cVar1 == '+') {
    lVar10 = (long)*pcVar9;
    uVar13 = 0x100;
    uVar11 = 0x100;
    uVar12 = 0x100;
    __nptr = pcVar9;
  }
  else {
    uVar13 = 0;
    uVar11 = 0;
    uVar12 = 0;
  }
  pp_Var4 = __ctype_tolower_loc();
  iVar8 = (*pp_Var4)[lVar10];
  switch(iVar8) {
  case 0x61:
    uVar12 = uVar11 | 0x20;
    break;
  case 0x62:
  case 99:
  case 100:
switchD_001126e9_caseD_62:
    if ((*(byte *)((long)puVar2 + lVar10 * 2 + 1) & 8) == 0) {
      return -1;
    }
    goto LAB_00112743;
  case 0x65:
switchD_001126e9_caseD_65:
    uVar12 = uVar13 | 0x20;
    goto LAB_00112740;
  case 0x66:
    local_4c = '\x06';
    goto LAB_0011272b;
  case 0x67:
    local_4c = '\0';
LAB_0011272b:
    __nptr = __nptr + 1;
    goto LAB_0011274b;
  default:
    if (iVar8 == 0x6f) {
      uVar13 = uVar12 | 2;
      goto switchD_001126e9_caseD_65;
    }
    if (iVar8 != 0x78) goto switchD_001126e9_caseD_62;
  }
  uVar12 = uVar12 | 0x11;
LAB_00112740:
  __nptr = __nptr + 1;
LAB_00112743:
  local_4c = '\0';
LAB_0011274b:
  uVar5 = strtol(__nptr,&local_38,0);
  iVar8 = -1;
  if (local_38 != __nptr) {
    if (uVar5 < 0x100) {
      cVar1 = *local_38;
      if (((long)cVar1 == 0) || ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
        ptr->flags = uVar12;
        ptr->width = (uint8_t)uVar5;
        ptr->dec = local_4c;
        iVar8 = (int)local_38 - (int)src;
      }
      else if (cVar1 == '.') {
        pcVar9 = local_38 + 1;
        uVar6 = strtol(pcVar9,&local_38,0);
        if ((local_38 != pcVar9) && (iVar8 = -2, uVar6 < 0x7f)) {
          ptr->flags = uVar12;
          ptr->width = (uint8_t)uVar5;
          ptr->dec = (uint8_t)uVar6;
          iVar8 = (int)local_38 - (int)src;
        }
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        iVar8 = -3;
      }
    }
    else {
      iVar8 = -2;
    }
  }
  return iVar8;
}

Assistant:

extern int mpt_valfmt_get(MPT_STRUCT(value_format) *ptr, const char *src)
{
	MPT_STRUCT(value_format) fmt = MPT_VALFMT_INIT;
	const char *pos;
	char *next;
	long val;
	
	if (!(pos = src)) {
		*ptr = fmt;
		return 0;
	}
	while (isspace(*pos)) {
		pos++;
	}
	/* select format */
	if (!*pos) {
		*ptr = fmt;
		return pos - src;
	}
	if (*pos == '+') {
		fmt.flags |= MPT_VALFMT(Sign);
		++pos;
	}
	
	switch (tolower(*pos)) {
	  case 'f': fmt.dec = 6; /* fall through */
	  case 'g': ++pos; break;
	  case 'a': fmt.flags |= MPT_VALFMT(Scientific); /* fall through */
	  case 'x': fmt.flags |= MPT_VALFMT(NumberHex); ++pos; break;
	  case 'o': fmt.flags |= MPT_VALFMT(IntOctal); /* fall through */
	  case 'e': fmt.flags |= MPT_VALFMT(Scientific); ++pos; break;
	  default:
		if (!isdigit(*pos)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get field with */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val > UINT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.width = val;
	if (!*pos || isspace(*pos)) {
		*ptr = fmt;
		return pos - src;
	}
	if (*(pos++) != '.') {
		errno = EINVAL;
		return -3;
	}
	/* get digits after decimal point */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val >= INT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.dec = val;
	
	*ptr = fmt;
	
	return pos - src;
}